

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgstrf.c
# Opt level: O0

void cgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  int *piVar1;
  flops_t *pfVar2;
  int iVar3;
  int_t iVar4;
  int local_1bc;
  int local_1ac;
  int local_1a4;
  flops_t *ops;
  int *panel_histo;
  int_t local_188;
  int_t nnzU;
  int_t nnzL;
  int iperm_r_allocated;
  int usepr;
  int w_def;
  int fsupc;
  int jsupno;
  int min_mn;
  int n;
  int m;
  int_t nextu;
  int_t nextlu;
  int_t new_next;
  int_t iinfo;
  int_t k;
  int_t i;
  int icol;
  int kcol;
  int jj;
  int jcol;
  int nseg;
  int nseg1;
  int pivrow;
  double diag_pivot_thresh;
  float local_120;
  fact_t fact;
  float fill_ratio;
  int_t nzlumax;
  int *supno;
  int *xsup;
  int_t *xusub;
  int_t *xlusup;
  int_t *xlsub;
  int_t *xa_end;
  int_t *xa_begin;
  int_t *asub;
  singlecomplex *a;
  int *relax_end;
  singlecomplex *tempv;
  singlecomplex *dense;
  int *marker;
  int_t *xplore;
  int_t *xprune;
  int *panel_lsub;
  int *parent;
  int *repfnz;
  int *segrep;
  singlecomplex *cwork;
  int *iwork;
  int *iperm_c;
  int *iperm_r;
  NCPformat *Astore;
  void *work_local;
  int *etree_local;
  int panel_size_local;
  int relax_local;
  SuperMatrix *A_local;
  superlu_options_t *options_local;
  
  iperm_c = (int *)0x0;
  Astore = (NCPformat *)work;
  work_local = etree;
  etree_local._0_4_ = panel_size;
  etree_local._4_4_ = relax;
  _panel_size_local = A;
  A_local = (SuperMatrix *)options;
  iVar3 = sp_ienv(6);
  local_120 = (float)iVar3;
  diag_pivot_thresh._4_4_ = A_local->Stype;
  _nseg1 = A_local->Store;
  nnzU = 0;
  piVar1 = stat->panel_histo;
  pfVar2 = stat->ops;
  nextlu = 0;
  min_mn = _panel_size_local->nrow;
  jsupno = _panel_size_local->ncol;
  local_1a4 = jsupno;
  if (min_mn < jsupno) {
    local_1a4 = min_mn;
  }
  fsupc = local_1a4;
  iperm_r = (int *)_panel_size_local->Store;
  asub = *(int_t **)(iperm_r + 2);
  xa_begin = *(int_t **)(iperm_r + 4);
  xa_end = *(int_t **)(iperm_r + 6);
  xlsub = *(int_t **)(iperm_r + 8);
  iVar4 = cLUMemInit(diag_pivot_thresh._4_4_,Astore,lwork,min_mn,jsupno,*iperm_r,(int)etree_local,
                     local_120,L,U,Glu,(int **)&cwork,(singlecomplex **)&segrep);
  *info = iVar4;
  if (*info == 0) {
    supno = Glu->xsup;
    _fill_ratio = Glu->supno;
    xlusup = Glu->xlsub;
    xusub = Glu->xlusup;
    xsup = Glu->xusub;
    SetIWork(min_mn,jsupno,(int)etree_local,(int *)cwork,&repfnz,&panel_lsub,&marker,&parent,&xprune
             ,&xplore,(int **)&dense);
    cSetRWork(min_mn,(int)etree_local,(singlecomplex *)segrep,&tempv,(singlecomplex **)&relax_end);
    nnzL = (int_t)(diag_pivot_thresh._4_4_ == SamePattern_SameRowPerm);
    if (nnzL != 0) {
      iperm_c = int32Malloc(min_mn);
      for (new_next = 0; new_next < min_mn; new_next = new_next + 1) {
        iperm_c[perm_r[new_next]] = new_next;
      }
      nnzU = 1;
    }
    iwork = int32Malloc(jsupno);
    for (new_next = 0; new_next < jsupno; new_next = new_next + 1) {
      iwork[perm_c[new_next]] = new_next;
    }
    a = (singlecomplex *)intMalloc(jsupno);
    if (A_local[1].Stype == SLU_NCP) {
      heap_relax_snode(jsupno,(int *)work_local,etree_local._4_4_,(int *)dense,(int *)a);
    }
    else {
      relax_snode(jsupno,(int *)work_local,etree_local._4_4_,(int *)dense,(int *)a);
    }
    ifill(perm_r,min_mn,-1);
    ifill((int *)dense,min_mn * 3,-1);
    *_fill_ratio = -1;
    *xusub = 0;
    *xsup = 0;
    *xlusup = 0;
    *supno = 0;
    iperm_r_allocated = (int)etree_local;
    kcol = 0;
    while (kcol < fsupc) {
      if ((&a->r)[kcol] == -NAN) {
        etree_local._0_4_ = iperm_r_allocated;
        new_next = kcol;
        do {
          new_next = new_next + 1;
          if (kcol + iperm_r_allocated < fsupc) {
            local_1ac = kcol + iperm_r_allocated;
          }
          else {
            local_1ac = fsupc;
          }
          if (local_1ac <= new_next) goto LAB_00108e8b;
        } while ((&a->r)[new_next] == -NAN);
        etree_local._0_4_ = new_next - kcol;
LAB_00108e8b:
        if (new_next == fsupc) {
          etree_local._0_4_ = fsupc - kcol;
        }
        piVar1[(int)etree_local] = piVar1[(int)etree_local] + 1;
        cpanel_dfs(min_mn,(int)etree_local,kcol,_panel_size_local,perm_r,&jcol,tempv,xprune,repfnz,
                   parent,xplore,(int *)dense,panel_lsub,marker,Glu);
        cpanel_bmod(min_mn,(int)etree_local,kcol,jcol,tempv,(singlecomplex *)relax_end,repfnz,parent
                    ,Glu,stat);
        for (icol = kcol; icol < kcol + (int)etree_local; icol = icol + 1) {
          new_next = (icol - kcol) * min_mn;
          jj = jcol;
          iVar3 = ccolumn_dfs(min_mn,icol,perm_r,&jj,xprune + new_next,repfnz,parent + new_next,
                              xplore,(int *)dense,panel_lsub,marker,Glu);
          *info = iVar3;
          if (iVar3 != 0) {
            return;
          }
          iVar3 = ccolumn_bmod(icol,jj - jcol,tempv + new_next,(singlecomplex *)relax_end,
                               repfnz + jcol,parent + new_next,kcol,Glu,stat);
          *info = iVar3;
          if (iVar3 != 0) {
            return;
          }
          iVar3 = ccopy_to_ucol(icol,jj,repfnz,parent + new_next,perm_r,tempv + new_next,Glu);
          *info = iVar3;
          if (iVar3 != 0) {
            return;
          }
          iVar3 = cpivotL(icol,(double)_nseg1,&nnzL,perm_r,iperm_c,iwork,&nseg,Glu,stat);
          *info = iVar3;
          if ((iVar3 != 0) && (nextlu == 0)) {
            nextlu = *info;
          }
          cpruneL(icol,perm_r,nseg,jj,repfnz,parent + new_next,xplore,Glu);
          resetrep_col(jj,repfnz,parent + new_next);
        }
        kcol = (int)etree_local + kcol;
      }
      else {
        i = (int_t)(&a->r)[kcol];
        iVar3 = (i - kcol) + 1;
        piVar1[iVar3] = piVar1[iVar3] + 1;
        iVar4 = csnode_dfs(kcol,i,xa_begin,xa_end,xlsub,xplore,(int *)dense,Glu);
        *info = iVar4;
        if (iVar4 != 0) {
          return;
        }
        n = xsup[kcol];
        m = xusub[kcol];
        w_def = _fill_ratio[kcol];
        usepr = supno[w_def];
        nextu = m + (xlusup[usepr + 1] - xlusup[usepr]) * ((i - kcol) + 1);
        fact = Glu->nzlumax;
        while ((int)fact < nextu) {
          iVar4 = cLUMemXpand(kcol,m,LUSUP,(int_t *)&fact,Glu);
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
        }
        for (k = kcol; k <= i; k = k + 1) {
          xsup[k + 1] = n;
          for (new_next = xa_end[k]; new_next < xlsub[k]; new_next = new_next + 1) {
            tempv[xa_begin[new_next]] = *(singlecomplex *)(asub + (long)new_next * 2);
          }
          csnode_bmod(k,w_def,usepr,tempv,(singlecomplex *)relax_end,Glu,stat);
          iVar3 = cpivotL(k,(double)_nseg1,&nnzL,perm_r,iperm_c,iwork,&nseg,Glu,stat);
          *info = iVar3;
          if ((iVar3 != 0) && (nextlu == 0)) {
            nextlu = *info;
          }
        }
        kcol = k;
      }
    }
    *info = nextlu;
    if (nextlu == 0) {
      local_1bc = jsupno;
    }
    else {
      local_1bc = nextlu + -1;
    }
    new_next = local_1bc;
    if (local_1bc < min_mn) {
      for (iinfo = 0; iinfo < min_mn && new_next < min_mn; iinfo = iinfo + 1) {
        if (perm_r[iinfo] == -1) {
          perm_r[iinfo] = new_next;
          new_next = new_next + 1;
        }
      }
    }
    countnz(fsupc,xplore,&local_188,(int_t *)((long)&panel_histo + 4),Glu);
    fixupL(fsupc,perm_r,Glu);
    cLUWorkFree((int *)cwork,(singlecomplex *)segrep,Glu);
    superlu_free(marker);
    superlu_free(xplore);
    if (diag_pivot_thresh._4_4_ == SamePattern_SameRowPerm) {
      *(int_t *)L->Store = local_188;
      *(int *)((long)L->Store + 4) = Glu->supno[jsupno];
      *(void **)((long)L->Store + 8) = Glu->lusup;
      *(int_t **)((long)L->Store + 0x10) = Glu->xlusup;
      *(int_t **)((long)L->Store + 0x18) = Glu->lsub;
      *(int_t **)((long)L->Store + 0x20) = Glu->xlsub;
      *(int_t *)U->Store = panel_histo._4_4_;
      *(void **)((long)U->Store + 8) = Glu->ucol;
      *(int_t **)((long)U->Store + 0x10) = Glu->usub;
      *(int_t **)((long)U->Store + 0x18) = Glu->xusub;
    }
    else {
      cCreate_SuperNode_Matrix
                (L,_panel_size_local->nrow,fsupc,local_188,(singlecomplex *)Glu->lusup,Glu->xlusup,
                 Glu->lsub,Glu->xlsub,Glu->supno,Glu->xsup,SLU_SC,SLU_C,SLU_TRLU);
      cCreate_CompCol_Matrix
                (U,fsupc,fsupc,panel_histo._4_4_,(singlecomplex *)Glu->ucol,Glu->usub,Glu->xusub,
                 SLU_NC,SLU_C,SLU_TRU);
    }
    pfVar2[7] = pfVar2[0x13] + pfVar2[0x14] + pfVar2[7];
    iVar3 = Glu->num_expansions + -1;
    Glu->num_expansions = iVar3;
    stat->expansions = iVar3;
    if (nnzU != 0) {
      superlu_free(iperm_c);
    }
    superlu_free(iwork);
    superlu_free(a);
  }
  return;
}

Assistant:

void
cgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    singlecomplex    *cwork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    singlecomplex    *dense, *tempv;
    int       *relax_end;
    singlecomplex    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    float fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = cLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &cwork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    cSetRWork(m, panel_size, cwork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = csnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = cLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        csnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = cpivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		cprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    cpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    cpanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = ccolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = ccolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = ccopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = cpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	cpruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		cprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    cLUWorkFree(iwork, cwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (singlecomplex *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (singlecomplex *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        cCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (singlecomplex *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_C, SLU_TRLU);
    	cCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (singlecomplex *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_C, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}